

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall
Lib::DArray<Lib::ArrayMapEntry<unsigned_int>_>::expand
          (DArray<Lib::ArrayMapEntry<unsigned_int>_> *this,size_t s)

{
  size_t sVar1;
  ArrayMapEntry<unsigned_int> *pAVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  ArrayMapEntry<unsigned_int> *pAVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ArrayMapEntry<unsigned_int> *pAVar11;
  ulong uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  uVar9 = this->_capacity;
  if (uVar9 < s) {
    uVar8 = uVar9 * 2;
    if (uVar9 * 2 <= s) {
      uVar8 = s;
    }
    uVar12 = uVar8 * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar12 == 0) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar12 < 0x11) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar12 < 0x19) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar12 < 0x21) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar12 < 0x31) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar12 < 0x41) {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pAVar7 = (ArrayMapEntry<unsigned_int> *)::operator_new(uVar12,0x10);
    }
    sVar1 = this->_size;
    pAVar2 = this->_array;
    this->_capacity = uVar8;
    this->_array = pAVar7;
    pAVar11 = pAVar7;
    if (sVar1 != 0) {
      lVar6 = 0;
      do {
        lVar10 = lVar6;
        *(undefined8 *)((long)&pAVar7->_obj + lVar10) =
             *(undefined8 *)((long)&pAVar2->_obj + lVar10);
        lVar6 = lVar10 + 8;
      } while (sVar1 << 3 != lVar10 + 8);
      pAVar11 = (ArrayMapEntry<unsigned_int> *)((long)&pAVar7[1]._obj + lVar10);
    }
    auVar5 = _DAT_00871040;
    auVar4 = _DAT_00871030;
    auVar3 = _DAT_00871020;
    if (pAVar11 != pAVar7 + uVar8) {
      uVar12 = (long)pAVar7 + (uVar8 * 8 - (long)pAVar11) + -8;
      auVar16._8_4_ = (int)uVar12;
      auVar16._0_8_ = uVar12;
      auVar16._12_4_ = (int)(uVar12 >> 0x20);
      auVar13._0_8_ = uVar12 >> 3;
      auVar13._8_8_ = auVar16._8_8_ >> 3;
      uVar8 = 0;
      auVar13 = auVar13 ^ _DAT_00871040;
      do {
        auVar15._8_4_ = (int)uVar8;
        auVar15._0_8_ = uVar8;
        auVar15._12_4_ = (int)(uVar8 >> 0x20);
        auVar16 = (auVar15 | auVar4) ^ auVar5;
        iVar14 = auVar13._4_4_;
        if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                    iVar14 < auVar16._4_4_) & 1)) {
          pAVar11[uVar8]._timestamp = 0;
        }
        if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
            auVar16._12_4_ <= auVar13._12_4_) {
          pAVar11[uVar8 + 1]._timestamp = 0;
        }
        auVar16 = (auVar15 | auVar3) ^ auVar5;
        iVar17 = auVar16._4_4_;
        if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar16._0_4_ <= auVar13._0_4_)) {
          pAVar11[uVar8 + 2]._timestamp = 0;
          pAVar11[uVar8 + 3]._timestamp = 0;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar12 >> 3) + 4 & 0xfffffffffffffffc) != uVar8);
    }
    this->_size = s;
    if (pAVar2 != (ArrayMapEntry<unsigned_int> *)0x0) {
      uVar9 = uVar9 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar9 == 0) {
        pAVar2->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        pAVar2->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pAVar2;
      }
      else if (uVar9 < 0x11) {
        pAVar2->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        pAVar2->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pAVar2;
      }
      else if (uVar9 < 0x19) {
        pAVar2->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        pAVar2->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pAVar2;
      }
      else if (uVar9 < 0x21) {
        pAVar2->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        pAVar2->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pAVar2;
      }
      else if (uVar9 < 0x31) {
        pAVar2->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        pAVar2->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pAVar2;
      }
      else {
        if (0x40 < uVar9) {
          operator_delete(pAVar2,0x10);
          return;
        }
        pAVar2->_obj = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        pAVar2->_timestamp = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pAVar2;
      }
    }
  }
  else {
    this->_size = s;
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }